

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  FileDescriptorTables *this_00;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar1;
  bool bVar2;
  FieldDescriptorProto_Type FVar3;
  CppType CVar4;
  int iVar5;
  FieldOptions *pFVar6;
  EnumDescriptor *pEVar7;
  EnumDescriptor *pEVar8;
  EnumValueDescriptor *pEVar9;
  string *psVar10;
  Descriptor *pDVar11;
  string *psVar12;
  Symbol SVar13;
  SubstituteArg *in_stack_fffffffffffff548;
  bool local_911;
  SubstituteArg local_878;
  SubstituteArg local_848;
  SubstituteArg local_818;
  SubstituteArg local_7e8;
  SubstituteArg local_7b8;
  SubstituteArg local_788;
  SubstituteArg local_758;
  SubstituteArg local_728;
  SubstituteArg local_6f8;
  SubstituteArg local_6c8;
  string local_698;
  SubstituteArg local_678;
  SubstituteArg local_648;
  SubstituteArg local_618;
  SubstituteArg local_5e8;
  SubstituteArg local_5b8;
  SubstituteArg local_588;
  SubstituteArg local_558;
  SubstituteArg local_528;
  SubstituteArg local_4f8;
  SubstituteArg local_4c8;
  string local_498;
  FieldDescriptor *local_478;
  FieldDescriptor *conflicting_field;
  string local_468;
  allocator<char> local_441;
  string local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  Type local_3a0;
  Symbol default_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  allocator<char> local_349;
  string local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  Symbol type;
  undefined1 local_290 [7];
  bool expecting_enum;
  SubstituteArg local_260;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  Symbol extendee;
  FieldDescriptorProto *proto_local;
  FieldDescriptor *field_local;
  DescriptorBuilder *this_local;
  
  extendee.field_1 = (anon_union_8_7_bfa3a334_for_Symbol_2)proto;
  if (*(long *)(field + 0x60) == 0) {
    pFVar6 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x60) = pFVar6;
  }
  bVar2 = FieldDescriptorProto::has_extendee((FieldDescriptorProto *)extendee.field_1.descriptor);
  if (bVar2) {
    psVar10 = FieldDescriptorProto::extendee_abi_cxx11_
                        ((FieldDescriptorProto *)extendee.field_1.descriptor);
    psVar12 = FieldDescriptor::full_name_abi_cxx11_(field);
    SVar13 = LookupSymbol(this,psVar10,psVar12,PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL);
    extendee._0_8_ = SVar13.field_1;
    local_40._0_4_ = SVar13.type;
    bVar2 = anon_unknown_1::Symbol::IsNull((Symbol *)local_40);
    if (bVar2) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      psVar12 = FieldDescriptorProto::extendee_abi_cxx11_
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
      AddNotDefinedError(this,psVar10,(Message *)aVar1.descriptor,EXTENDEE,psVar12);
      return;
    }
    if (local_40._0_4_ != MESSAGE) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      psVar12 = FieldDescriptorProto::extendee_abi_cxx11_
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
      std::operator+(&local_80,"\"",psVar12);
      std::operator+(&local_60,&local_80,"\" is not a message type.");
      AddError(this,psVar10,(Message *)aVar1.descriptor,EXTENDEE,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      return;
    }
    *(undefined8 *)(field + 0x38) = extendee._0_8_;
    pDVar11 = FieldDescriptor::containing_type(field);
    iVar5 = FieldDescriptor::number(field);
    bVar2 = Descriptor::IsExtensionNumber(pDVar11,iVar5);
    if (!bVar2) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      pDVar11 = FieldDescriptor::containing_type(field);
      psVar12 = Descriptor::full_name_abi_cxx11_(pDVar11);
      strings::internal::SubstituteArg::SubstituteArg(&local_e0,psVar12);
      iVar5 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_110,iVar5);
      strings::internal::SubstituteArg::SubstituteArg(&local_140);
      strings::internal::SubstituteArg::SubstituteArg(&local_170);
      strings::internal::SubstituteArg::SubstituteArg(&local_1a0);
      strings::internal::SubstituteArg::SubstituteArg(&local_1d0);
      strings::internal::SubstituteArg::SubstituteArg(&local_200);
      strings::internal::SubstituteArg::SubstituteArg(&local_230);
      strings::internal::SubstituteArg::SubstituteArg(&local_260);
      strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_290);
      strings::Substitute_abi_cxx11_
                (&local_b0,(strings *)"\"$0\" does not declare $1 as an extension number.",
                 (char *)&local_e0,&local_110,&local_140,&local_170,&local_1a0,&local_1d0,&local_200
                 ,&local_230,&local_260,(SubstituteArg *)local_290,in_stack_fffffffffffff548);
      AddError(this,psVar10,(Message *)aVar1.descriptor,NUMBER,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  bVar2 = FieldDescriptorProto::has_type_name((FieldDescriptorProto *)extendee.field_1.descriptor);
  if (bVar2) {
    FVar3 = FieldDescriptorProto::type((FieldDescriptorProto *)extendee.field_1.descriptor);
    local_911 = true;
    if (FVar3 != FieldDescriptorProto_Type_TYPE_ENUM) {
      local_911 = FieldDescriptorProto::has_default_value
                            ((FieldDescriptorProto *)extendee.field_1.descriptor);
    }
    type.field_1._7_1_ = local_911;
    psVar10 = FieldDescriptorProto::type_name_abi_cxx11_
                        ((FieldDescriptorProto *)extendee.field_1.descriptor);
    psVar12 = FieldDescriptor::full_name_abi_cxx11_(field);
    SVar13 = LookupSymbol(this,psVar10,psVar12,(uint)((type.field_1._7_1_ & 1) != 0),LOOKUP_TYPES);
    type._0_8_ = SVar13.field_1;
    local_2a8._0_4_ = SVar13.type;
    bVar2 = anon_unknown_1::Symbol::IsNull((Symbol *)local_2a8);
    if (bVar2) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      psVar12 = FieldDescriptorProto::type_name_abi_cxx11_
                          ((FieldDescriptorProto *)extendee.field_1.descriptor);
      AddNotDefinedError(this,psVar10,(Message *)aVar1.descriptor,TYPE,psVar12);
      return;
    }
    bVar2 = FieldDescriptorProto::has_type((FieldDescriptorProto *)extendee.field_1.descriptor);
    if (!bVar2) {
      if (local_2a8._0_4_ == MESSAGE) {
        *(undefined4 *)(field + 0x2c) = 0xb;
      }
      else {
        if (local_2a8._0_4_ != ENUM) {
          psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
          aVar1 = extendee.field_1;
          psVar12 = FieldDescriptorProto::type_name_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.field_1.descriptor);
          std::operator+(&local_2e8,"\"",psVar12);
          std::operator+(&local_2c8,&local_2e8,"\" is not a type.");
          AddError(this,psVar10,(Message *)aVar1.descriptor,TYPE,&local_2c8);
          std::__cxx11::string::~string((string *)&local_2c8);
          std::__cxx11::string::~string((string *)&local_2e8);
          return;
        }
        *(undefined4 *)(field + 0x2c) = 0xe;
      }
    }
    CVar4 = FieldDescriptor::cpp_type(field);
    if (CVar4 == CPPTYPE_MESSAGE) {
      if (local_2a8._0_4_ != MESSAGE) {
        psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
        aVar1 = extendee.field_1;
        psVar12 = FieldDescriptorProto::type_name_abi_cxx11_
                            ((FieldDescriptorProto *)extendee.field_1.descriptor);
        std::operator+(&local_328,"\"",psVar12);
        std::operator+(&local_308,&local_328,"\" is not a message type.");
        AddError(this,psVar10,(Message *)aVar1.descriptor,TYPE,&local_308);
        std::__cxx11::string::~string((string *)&local_308);
        std::__cxx11::string::~string((string *)&local_328);
        return;
      }
      *(undefined8 *)(field + 0x48) = type._0_8_;
      bVar2 = FieldDescriptor::has_default_value(field);
      if (bVar2) {
        psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
        aVar1 = extendee.field_1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,"Messages can\'t have default values.",&local_349);
        AddError(this,psVar10,(Message *)aVar1.descriptor,DEFAULT_VALUE,&local_348);
        std::__cxx11::string::~string((string *)&local_348);
        std::allocator<char>::~allocator(&local_349);
      }
    }
    else {
      CVar4 = FieldDescriptor::cpp_type(field);
      if (CVar4 == CPPTYPE_ENUM) {
        if (local_2a8._0_4_ != ENUM) {
          psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
          aVar1 = extendee.field_1;
          psVar12 = FieldDescriptorProto::type_name_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.field_1.descriptor);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &default_value.field_1,"\"",psVar12);
          std::operator+(&local_370,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &default_value.field_1,"\" is not an enum type.");
          AddError(this,psVar10,(Message *)aVar1.descriptor,TYPE,&local_370);
          std::__cxx11::string::~string((string *)&local_370);
          std::__cxx11::string::~string((string *)&default_value.field_1);
          return;
        }
        *(undefined8 *)(field + 0x50) = type._0_8_;
        pEVar7 = FieldDescriptor::enum_type(field);
        if (((byte)pEVar7[0x28] & 1) != 0) {
          field[0x68] = (FieldDescriptor)0x0;
        }
        bVar2 = FieldDescriptor::has_default_value(field);
        if (bVar2) {
          psVar10 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.field_1.descriptor);
          pEVar7 = FieldDescriptor::enum_type(field);
          psVar12 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
          SVar13 = LookupSymbolNoPlaceholder(this,psVar10,psVar12,LOOKUP_ALL);
          default_value._0_8_ = SVar13.field_1;
          local_3a0 = SVar13.type;
          if (local_3a0 == ENUM_VALUE) {
            pEVar7 = EnumValueDescriptor::type((EnumValueDescriptor *)default_value._0_8_);
            pEVar8 = FieldDescriptor::enum_type(field);
            if (pEVar7 == pEVar8) {
              *(undefined8 *)(field + 0x70) = default_value._0_8_;
              goto LAB_002c79f9;
            }
          }
          psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
          aVar1 = extendee.field_1;
          pEVar7 = FieldDescriptor::enum_type(field);
          psVar12 = EnumDescriptor::full_name_abi_cxx11_(pEVar7);
          std::operator+(&local_420,"Enum type \"",psVar12);
          std::operator+(&local_400,&local_420,"\" has no value named \"");
          psVar12 = FieldDescriptorProto::default_value_abi_cxx11_
                              ((FieldDescriptorProto *)extendee.field_1.descriptor);
          std::operator+(&local_3e0,&local_400,psVar12);
          std::operator+(&local_3c0,&local_3e0,"\".");
          AddError(this,psVar10,(Message *)aVar1.descriptor,DEFAULT_VALUE,&local_3c0);
          std::__cxx11::string::~string((string *)&local_3c0);
          std::__cxx11::string::~string((string *)&local_3e0);
          std::__cxx11::string::~string((string *)&local_400);
          std::__cxx11::string::~string((string *)&local_420);
        }
        else {
          pEVar7 = FieldDescriptor::enum_type(field);
          iVar5 = EnumDescriptor::value_count(pEVar7);
          if (0 < iVar5) {
            pEVar7 = FieldDescriptor::enum_type(field);
            pEVar9 = EnumDescriptor::value(pEVar7,0);
            *(EnumValueDescriptor **)(field + 0x70) = pEVar9;
          }
        }
      }
      else {
        psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
        aVar1 = extendee.field_1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_440,"Field with primitive type has type_name.",&local_441);
        AddError(this,psVar10,(Message *)aVar1.descriptor,TYPE,&local_440);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator(&local_441);
      }
    }
  }
  else {
    CVar4 = FieldDescriptor::cpp_type(field);
    if ((CVar4 == CPPTYPE_MESSAGE) ||
       (CVar4 = FieldDescriptor::cpp_type(field), CVar4 == CPPTYPE_ENUM)) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"Field with message or enum type missing type_name.",
                 (allocator<char> *)((long)&conflicting_field + 7));
      AddError(this,psVar10,(Message *)aVar1.descriptor,TYPE,&local_468);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator((allocator<char> *)((long)&conflicting_field + 7));
    }
  }
LAB_002c79f9:
  bVar2 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
  if (!bVar2) {
    this_00 = this->file_tables_;
    pDVar11 = FieldDescriptor::containing_type(field);
    iVar5 = FieldDescriptor::number(field);
    local_478 = FileDescriptorTables::FindFieldByNumber(this_00,pDVar11,iVar5);
    bVar2 = FieldDescriptor::is_extension(field);
    if (bVar2) {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      iVar5 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_4c8,iVar5);
      pDVar11 = FieldDescriptor::containing_type(field);
      psVar12 = Descriptor::full_name_abi_cxx11_(pDVar11);
      strings::internal::SubstituteArg::SubstituteArg(&local_4f8,psVar12);
      psVar12 = FieldDescriptor::full_name_abi_cxx11_(local_478);
      strings::internal::SubstituteArg::SubstituteArg(&local_528,psVar12);
      strings::internal::SubstituteArg::SubstituteArg(&local_558);
      strings::internal::SubstituteArg::SubstituteArg(&local_588);
      strings::internal::SubstituteArg::SubstituteArg(&local_5b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_5e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_618);
      strings::internal::SubstituteArg::SubstituteArg(&local_648);
      strings::internal::SubstituteArg::SubstituteArg(&local_678);
      strings::Substitute_abi_cxx11_
                (&local_498,
                 (strings *)
                 "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                 (char *)&local_4c8,&local_4f8,&local_528,&local_558,&local_588,&local_5b8,
                 &local_5e8,&local_618,&local_648,&local_678,in_stack_fffffffffffff548);
      AddError(this,psVar10,(Message *)aVar1.descriptor,NUMBER,&local_498);
      std::__cxx11::string::~string((string *)&local_498);
    }
    else {
      psVar10 = FieldDescriptor::full_name_abi_cxx11_(field);
      aVar1 = extendee.field_1;
      iVar5 = FieldDescriptor::number(field);
      strings::internal::SubstituteArg::SubstituteArg(&local_6c8,iVar5);
      pDVar11 = FieldDescriptor::containing_type(field);
      psVar12 = Descriptor::full_name_abi_cxx11_(pDVar11);
      strings::internal::SubstituteArg::SubstituteArg(&local_6f8,psVar12);
      psVar12 = FieldDescriptor::name_abi_cxx11_(local_478);
      strings::internal::SubstituteArg::SubstituteArg(&local_728,psVar12);
      strings::internal::SubstituteArg::SubstituteArg(&local_758);
      strings::internal::SubstituteArg::SubstituteArg(&local_788);
      strings::internal::SubstituteArg::SubstituteArg(&local_7b8);
      strings::internal::SubstituteArg::SubstituteArg(&local_7e8);
      strings::internal::SubstituteArg::SubstituteArg(&local_818);
      strings::internal::SubstituteArg::SubstituteArg(&local_848);
      strings::internal::SubstituteArg::SubstituteArg(&local_878);
      strings::Substitute_abi_cxx11_
                (&local_698,
                 (strings *)"Field number $0 has already been used in \"$1\" by field \"$2\".",
                 (char *)&local_6c8,&local_6f8,&local_728,&local_758,&local_788,&local_7b8,
                 &local_7e8,&local_818,&local_848,&local_878,in_stack_fffffffffffff548);
      AddError(this,psVar10,(Message *)aVar1.descriptor,NUMBER,&local_698);
      std::__cxx11::string::~string((string *)&local_698);
    }
  }
  bVar2 = FieldDescriptor::is_extension(field);
  if (bVar2) {
    DescriptorPool::Tables::AddExtension(this->tables_,field);
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->options_ == NULL) {
    field->options_ = &FieldOptions::default_instance();
  }

  if (proto.has_extendee()) {
    Symbol extendee = LookupSymbol(proto.extendee(), field->full_name(),
                                   PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor;

    if (!field->containing_type()->IsExtensionNumber(field->number())) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("\"$0\" does not declare $1 as an "
                                   "extension number.",
                                   field->containing_type()->full_name(),
                                   field->number()));
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    Symbol type =
      LookupSymbol(proto.type_name(), field->full_name(),
                   expecting_enum ? PLACEHOLDER_ENUM : PLACEHOLDER_MESSAGE,
                   LOOKUP_TYPES);

    if (type.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::TYPE,
                         proto.type_name());
      return;
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (type.type != Symbol::MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }
      field->message_type_ = type.descriptor;

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      if (type.type != Symbol::ENUM) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }
      field->enum_type_ = type.enum_descriptor;

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // We can't just use field->enum_type()->FindValueByName() here
        // because that locks the pool's mutex, which we have already locked
        // at this point.
        Symbol default_value =
          LookupSymbolNoPlaceholder(proto.default_value(),
                                    field->enum_type()->full_name());

        if (default_value.type == Symbol::ENUM_VALUE &&
            default_value.enum_value_descriptor->type() == field->enum_type()) {
          field->default_value_enum_ = default_value.enum_value_descriptor;
        } else {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Enum type \"" + field->enum_type()->full_name() +
                   "\" has no value named \"" + proto.default_value() + "\".");
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  //   know their containing type until now.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field =
      file_tables_->FindFieldByNumber(field->containing_type(),
                                      field->number());
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                   "in \"$1\" by extension \"$2\".",
                                   field->number(),
                                   field->containing_type()->full_name(),
                                   conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                   "\"$1\" by field \"$2\".",
                                   field->number(),
                                   field->containing_type()->full_name(),
                                   conflicting_field->name()));
    }
  }

  if (field->is_extension()) {
    // No need for error checking: if the extension number collided,
    // we've already been informed of it by the if() above.
    tables_->AddExtension(field);
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);
}